

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  word *__s;
  int iVar1;
  uint uVar2;
  WirePointer *typedPtr;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  WirePointer *pWVar6;
  Fault f;
  Iterator __end7;
  Fault local_50;
  uint local_44;
  word *local_40;
  long local_38;
  
  if (segment->readOnly != false) {
    return;
  }
  switch((tag->offsetAndKind).value & 3) {
  case 0:
    uVar4 = (ulong)(tag->field_1).structRef.ptrCount.value;
    if (uVar4 != 0) {
      pWVar6 = (WirePointer *)(ptr + (tag->field_1).structRef.dataSize.value);
      do {
        zeroObject(segment,capTable,pWVar6);
        pWVar6 = pWVar6 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    iVar1 = (uint)(tag->field_1).structRef.ptrCount.value +
            (uint)(tag->field_1).structRef.dataSize.value;
    if (iVar1 == 0) {
      return;
    }
    uVar2 = iVar1 * 8;
    break;
  case 1:
    uVar2 = (tag->field_1).upper32Bits;
    switch(uVar2 & 7) {
    case 0:
      return;
    default:
      uVar4 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)((byte)uVar2 & 7) * 4) *
              (ulong)(uVar2 >> 3) + 0x3f;
      if ((int)(uVar4 >> 6) == 0) {
        return;
      }
      uVar2 = (uint)(uVar4 >> 3) & 0xfffffff8;
      break;
    case 6:
      if (7 < uVar2) {
        uVar4 = (ulong)(uVar2 >> 3);
        pWVar6 = (WirePointer *)ptr;
        do {
          zeroObject(segment,capTable,pWVar6);
          pWVar6 = pWVar6 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      if (uVar2 < 8) {
        return;
      }
      uVar2 = uVar2 & 0xfffffff8;
      break;
    case 7:
      uVar2 = (uint)ptr->content;
      if ((uVar2 & 3) != 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[54]>
                  (&local_50,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x2b7,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                   "\"Don\'t know how to handle non-STRUCT inline composite.\"",
                   (char (*) [54])"Don\'t know how to handle non-STRUCT inline composite.");
        kj::_::Debug::Fault::fatal(&local_50);
      }
      uVar2 = uVar2 >> 2 & 0x1fffffff;
      local_44 = (uint)*(ushort *)((long)&ptr->content + 6);
      local_40 = ptr;
      if ((local_44 != 0) && (uVar2 != 0)) {
        local_38 = (ulong)*(ushort *)((long)&ptr->content + 4) << 3;
        uVar5 = 0;
        do {
          ptr = (word *)((long)&(((WirePointer *)ptr)->offsetAndKind).value + local_38);
          uVar3 = local_44;
          do {
            ptr = (word *)((WirePointer *)ptr + 1);
            zeroObject(segment,capTable,(WirePointer *)ptr);
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar2);
      }
      __s = local_40;
      uVar4 = ((ulong)*(ushort *)((long)&local_40->content + 6) +
              (ulong)*(ushort *)((long)&local_40->content + 4)) * (ulong)uVar2;
      if (0x1ffffffe < uVar4) {
        zeroObject::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_50);
      }
      iVar1 = (int)uVar4 + 1;
      if (iVar1 == 0) {
        return;
      }
      memset(__s,0,(ulong)(uint)(iVar1 * 8));
      return;
    }
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d4,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
               (char (*) [24])"Unexpected FAR pointer.");
    goto LAB_00285c41;
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2d9,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
               (char (*) [26])"Unexpected OTHER pointer.");
LAB_00285c41:
    kj::_::Debug::Fault::~Fault(&local_50);
    return;
  }
  memset(ptr,0,(ulong)uVar2);
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }